

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O2

void __thiscall
Diligent::SPIRVShaderResources::MapHLSLVertexShaderInputs
          (SPIRVShaderResources *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *SPIRV)

{
  char cVar1;
  int iVar2;
  SPIRVShaderStageInputAttribs *Args;
  long lVar3;
  char *pcVar4;
  byte *__nptr;
  Uint32 i;
  uint n;
  char (*in_stack_ffffffffffffff98) [11];
  char *EndPtr;
  string msg;
  
  if (this->m_IsHLSLSource == false) {
    FormatString<char[45]>(&msg,(char (*) [45])"This method is only relevant for HLSL source");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"MapHLSLVertexShaderInputs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x336);
    std::__cxx11::string::~string((string *)&msg);
  }
  n = 0;
  do {
    if (this->m_NumShaderStageInputs <= n) {
      return;
    }
    Args = GetShaderStageInputAttribs(this,n);
    __nptr = (byte *)Args->Semantic;
    pcVar4 = MapHLSLVertexShaderInputs::Prefix;
    while( true ) {
      cVar1 = *pcVar4;
      if (*__nptr == 0) break;
      if (cVar1 == '\0') goto LAB_003219ab;
      iVar2 = tolower((uint)*__nptr);
      if (iVar2 != cVar1) goto LAB_00321960;
      pcVar4 = pcVar4 + 1;
      __nptr = __nptr + 1;
    }
    if (cVar1 == '\0') {
LAB_003219ab:
      EndPtr = (char *)0x0;
      lVar3 = strtol((char *)__nptr,&EndPtr,10);
      if (*EndPtr != '\0') {
        FormatString<char[25],char_const*,char[43],char_const*,char[11]>
                  (&msg,(Diligent *)"Unable to map semantic \'",(char (*) [25])Args,
                   (char **)"\' to input location: semantics must have \'",
                   (char (*) [43])&MapHLSLVertexShaderInputs::Prefix,(char **)"x\' format.",
                   in_stack_ffffffffffffff98);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
        }
        goto LAB_00321a14;
      }
      (SPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[Args->LocationDecorationOffset] = (uint)lVar3;
    }
    else {
LAB_00321960:
      FormatString<char[25],char_const*,char[43],char_const*,char[11]>
                (&msg,(Diligent *)"Unable to map semantic \'",(char (*) [25])Args,
                 (char **)"\' to input location: semantics must have \'",
                 (char (*) [43])&MapHLSLVertexShaderInputs::Prefix,(char **)"x\' format.",
                 in_stack_ffffffffffffff98);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
LAB_00321a14:
      std::__cxx11::string::~string((string *)&msg);
    }
    n = n + 1;
  } while( true );
}

Assistant:

void SPIRVShaderResources::MapHLSLVertexShaderInputs(std::vector<uint32_t>& SPIRV) const
{
    VERIFY(IsHLSLSource(), "This method is only relevant for HLSL source");

    for (Uint32 i = 0; i < GetNumShaderStageInputs(); ++i)
    {
        const SPIRVShaderStageInputAttribs& Input = GetShaderStageInputAttribs(i);

        const char*        s      = Input.Semantic;
        static const char* Prefix = "attrib";
        const char*        p      = Prefix;
        while (*s != 0 && *p != 0 && *p == std::tolower(static_cast<unsigned char>(*s)))
        {
            ++p;
            ++s;
        }

        if (*p != 0)
        {
            LOG_ERROR_MESSAGE("Unable to map semantic '", Input.Semantic, "' to input location: semantics must have '", Prefix, "x' format.");
            continue;
        }

        char*    EndPtr   = nullptr;
        uint32_t Location = static_cast<uint32_t>(strtol(s, &EndPtr, 10));
        if (*EndPtr != 0)
        {
            LOG_ERROR_MESSAGE("Unable to map semantic '", Input.Semantic, "' to input location: semantics must have '", Prefix, "x' format.");
            continue;
        }
        SPIRV[Input.LocationDecorationOffset] = Location;
    }
}